

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O2

void __thiscall QScanConverter::scanConvert<false>(QScanConverter *this)

{
  Line *pLVar1;
  uint uVar2;
  long lVar3;
  int y;
  Line **ppLVar4;
  long lVar5;
  int iVar6;
  int x;
  long lVar7;
  uint uVar8;
  long in_FS_OFFSET;
  ulong local_58;
  Line *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->m_lines).siz;
  if (lVar3 != 0) {
    pLVar1 = (this->m_lines).buffer;
    std::
    __sort<QScanConverter::Line*,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<false>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar1,pLVar1 + lVar3);
    y = ((this->m_lines).buffer)->top;
    lVar3 = 0;
LAB_003ce813:
    if (y <= this->m_bottom) {
      lVar3 = (long)(int)lVar3;
      for (lVar7 = lVar3 << 5;
          (lVar3 < (this->m_lines).siz &&
          (pLVar1 = (this->m_lines).buffer, *(int *)((long)&pLVar1->top + lVar7) == y));
          lVar7 = lVar7 + 0x20) {
        local_40 = (Line *)((long)&pLVar1->x + lVar7);
        QDataBuffer<QScanConverter::Line_*>::add(&this->m_active,&local_40);
        lVar3 = lVar3 + 1;
      }
      local_58 = (this->m_active).siz;
      lVar7 = 1;
      do {
        if ((int)local_58 <= lVar7) {
          iVar6 = 0;
          uVar8 = 0;
          lVar7 = 0;
          do {
            lVar7 = (long)(int)lVar7;
            x = iVar6;
            while( true ) {
              if ((int)local_58 <= (int)lVar7) {
                y = y + 1;
                goto LAB_003ce813;
              }
              pLVar1 = (this->m_active).buffer[lVar7];
              iVar6 = *(int *)((long)&pLVar1->x + 2);
              if ((this->m_fillRuleMask & uVar8) != 0) {
                QSpanBuffer::addSpan(this->m_spanBuffer,x,iVar6 - x,y,0xff);
              }
              uVar8 = uVar8 + pLVar1->winding;
              if (pLVar1->bottom == y) break;
              pLVar1->x = pLVar1->x + pLVar1->delta;
              lVar7 = lVar7 + 1;
              x = iVar6;
            }
            uVar2 = (int)local_58 - 1;
            local_58 = (ulong)uVar2;
            for (lVar5 = lVar7; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
              ppLVar4 = (this->m_active).buffer;
              ppLVar4[lVar5] = ppLVar4[lVar5 + 1];
            }
            QDataBuffer<QScanConverter::Line_*>::resize(&this->m_active,(long)(int)uVar2);
          } while( true );
        }
        ppLVar4 = (this->m_active).buffer;
        pLVar1 = ppLVar4[lVar7];
        for (lVar5 = lVar7; 0 < lVar5; lVar5 = lVar5 + -1) {
          if (ppLVar4[lVar5 + -1]->x <= pLVar1->x) goto LAB_003ce8a1;
          ppLVar4[lVar5] = ppLVar4[lVar5 + -1];
          ppLVar4 = (this->m_active).buffer;
        }
        lVar5 = 0;
LAB_003ce8a1:
        ppLVar4[(int)lVar5] = pLVar1;
        lVar7 = lVar7 + 1;
      } while( true );
    }
  }
  (this->m_active).siz = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}